

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O3

int mbedtls_asn1_write_int(uchar **p,uchar *start,int val)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  size_t len;
  
  puVar1 = *p;
  iVar3 = -0x6c;
  if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
    *p = puVar1 + -1;
    puVar1[-1] = (uchar)val;
    len = 1;
    if ((0 < val) && (puVar1 = *p, (char)*puVar1 < '\0')) {
      if (puVar1 == start || (long)puVar1 - (long)start < 0) {
        return -0x6c;
      }
      *p = puVar1 + -1;
      puVar1[-1] = '\0';
      len = 2;
    }
    iVar2 = mbedtls_asn1_write_len(p,start,len);
    iVar3 = iVar2;
    if ((-1 < iVar2) &&
       (puVar1 = *p, iVar3 = -0x6c, puVar1 != start && -1 < (long)puVar1 - (long)start)) {
      *p = puVar1 + -1;
      puVar1[-1] = '\x02';
      iVar3 = (int)len + iVar2 + 1;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_asn1_write_int( unsigned char **p, unsigned char *start, int val )
{
    int ret;
    size_t len = 0;

    // TODO negative values and values larger than 128
    // DER format assumes 2s complement for numbers, so the leftmost bit
    // should be 0 for positive numbers and 1 for negative numbers.
    //
    if( *p - start < 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    len += 1;
    *--(*p) = val;

    if( val > 0 && **p & 0x80 )
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = 0x00;
        len += 1;
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_INTEGER ) );

    return( (int) len );
}